

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  uint uVar1;
  xmlChar *value_00;
  uint local_4c;
  int ret;
  xmlChar *value;
  xmlNsPtr ns;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  if (elem == (xmlNodePtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if (((elem->type == XML_XINCLUDE_START) || (elem->type == XML_XINCLUDE_END)) ||
          (elem->type == XML_NAMESPACE_DECL)) {
    ctxt_local._4_4_ = 1;
  }
  else if (doc == (xmlDocPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else if (elem->type == XML_ENTITY_REF_NODE) {
    ctxt_local._4_4_ = 1;
  }
  else {
    local_4c = xmlValidateOneElement(ctxt,doc,elem);
    local_4c = local_4c & 1;
    if (elem->type == XML_ELEMENT_NODE) {
      for (ns = (xmlNsPtr)elem->properties; ns != (xmlNsPtr)0x0; ns = ns[1].next) {
        value_00 = xmlNodeListGetString(doc,(xmlNode *)ns->prefix,0);
        uVar1 = xmlValidateOneAttribute(ctxt,doc,elem,(xmlAttrPtr)ns,value_00);
        local_4c = uVar1 & local_4c;
        if (value_00 != (xmlChar *)0x0) {
          (*xmlFree)(value_00);
        }
      }
      for (value = (xmlChar *)elem->nsDef; value != (xmlChar *)0x0; value = *(xmlChar **)value) {
        if (elem->ns == (xmlNs *)0x0) {
          uVar1 = xmlValidateOneNamespace
                            (ctxt,doc,elem,(xmlChar *)0x0,(xmlNsPtr)value,
                             *(xmlChar **)(value + 0x10));
        }
        else {
          uVar1 = xmlValidateOneNamespace
                            (ctxt,doc,elem,elem->ns->prefix,(xmlNsPtr)value,
                             *(xmlChar **)(value + 0x10));
        }
        local_4c = uVar1 & local_4c;
      }
    }
    for (attr = (xmlAttrPtr)elem->children; attr != (xmlAttrPtr)0x0; attr = attr->next) {
      uVar1 = xmlValidateElement(ctxt,doc,(xmlNodePtr)attr);
      local_4c = uVar1 & local_4c;
    }
    ctxt_local._4_4_ = local_4c;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc, xmlNodePtr elem) {
    xmlNodePtr child;
    xmlAttrPtr attr;
    xmlNsPtr ns;
    const xmlChar *value;
    int ret = 1;

    if (elem == NULL) return(0);

    /*
     * XInclude elements were added after parsing in the infoset,
     * they don't really mean anything validation wise.
     */
    if ((elem->type == XML_XINCLUDE_START) ||
	(elem->type == XML_XINCLUDE_END) ||
	(elem->type == XML_NAMESPACE_DECL))
	return(1);

    CHECK_DTD;

    /*
     * Entities references have to be handled separately
     */
    if (elem->type == XML_ENTITY_REF_NODE) {
	return(1);
    }

    ret &= xmlValidateOneElement(ctxt, doc, elem);
    if (elem->type == XML_ELEMENT_NODE) {
	attr = elem->properties;
	while (attr != NULL) {
	    value = xmlNodeListGetString(doc, attr->children, 0);
	    ret &= xmlValidateOneAttribute(ctxt, doc, elem, attr, value);
	    if (value != NULL)
		xmlFree((char *)value);
	    attr= attr->next;
	}
	ns = elem->nsDef;
	while (ns != NULL) {
	    if (elem->ns == NULL)
		ret &= xmlValidateOneNamespace(ctxt, doc, elem, NULL,
					       ns, ns->href);
	    else
		ret &= xmlValidateOneNamespace(ctxt, doc, elem,
		                               elem->ns->prefix, ns, ns->href);
	    ns = ns->next;
	}
    }
    child = elem->children;
    while (child != NULL) {
        ret &= xmlValidateElement(ctxt, doc, child);
        child = child->next;
    }

    return(ret);
}